

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseFilters::~TestCaseFilters(TestCaseFilters *this)

{
  std::__cxx11::string::~string((string *)&this->m_name);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            (&this->m_exclusionFilters);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            (&this->m_inclusionFilters);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
            (&this->m_tagExpressions);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}